

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O2

size_t stumpless_param_into_string(stumpless_param *param,char *str,size_t max_size)

{
  size_t buffer_size;
  char *message;
  size_t sVar1;
  
  if (param == (stumpless_param *)0x0) {
    message = "param was NULL";
  }
  else {
    if (str != (char *)0x0) {
      lock_param(param);
      sVar1 = param->name_length + param->value_length + 4;
      if (max_size < sVar1) {
        raise_argument_too_small
                  ("buffer is too small for the given message",max_size,
                   "buffer used to store the message");
      }
      else {
        sVar1 = locked_param_into_buffer(param,str,buffer_size);
      }
      unlock_param(param);
      return sVar1;
    }
    message = "str was NULL";
  }
  raise_argument_empty(message);
  return 0;
}

Assistant:

size_t
stumpless_param_into_string( const struct stumpless_param *param, char *str, size_t max_size ) {
  size_t min_buff_size;

  VALIDATE_ARG_NOT_NULL_UNSIGNED_RETURN( param );
  VALIDATE_ARG_NOT_NULL_UNSIGNED_RETURN( str );

  lock_param( param );

  min_buff_size = locked_get_param_string_size( param );
  if ( min_buff_size > max_size ) {
    raise_argument_too_small( L10N_BUFFER_TOO_SMALL_ERROR_MESSAGE,
                              max_size,
                              L10N_BUFFER_SIZE_ERROR_CODE_TYPE );
    goto fail;
  }
  
  min_buff_size = locked_param_into_buffer( param, str, max_size );

  unlock_param( param );

  return min_buff_size;

fail:
  unlock_param( param );
  return min_buff_size;
}